

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QModelIndexList * __thiscall QItemSelection::indexes(QItemSelection *this)

{
  QModelIndexList *in_RDI;
  QItemSelection *in_stack_00000028;
  
  qSelectionIndexes<QList<QModelIndex>>(in_stack_00000028);
  return in_RDI;
}

Assistant:

QModelIndexList QItemSelection::indexes() const
{
    return qSelectionIndexes<QModelIndexList>(*this);
}